

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O1

size_type __thiscall llvm::StringRef::find_last_of(StringRef *this,StringRef Chars,size_t From)

{
  _WordT *p_Var1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  bitset<256UL> CharBits;
  bitset<256UL> local_38;
  
  local_38.super__Base_bitset<4UL>._M_w[2] = 0;
  local_38.super__Base_bitset<4UL>._M_w[3] = 0;
  local_38.super__Base_bitset<4UL>._M_w[0] = 0;
  local_38.super__Base_bitset<4UL>._M_w[1] = 0;
  if (Chars.Length != 0) {
    sVar3 = 0;
    do {
      p_Var1 = local_38.super__Base_bitset<4UL>._M_w + ((byte)Chars.Data[sVar3] >> 6);
      *p_Var1 = *p_Var1 | 1L << (Chars.Data[sVar3] & 0x3fU);
      sVar3 = sVar3 + 1;
    } while (Chars.Length != sVar3);
  }
  if (this->Length < From) {
    From = this->Length;
  }
  do {
    uVar4 = From - 1;
    if (From == 0) {
      return 0xffffffffffffffff;
    }
    bVar2 = std::bitset<256UL>::test(&local_38,(ulong)(byte)this->Data[From - 1]);
    From = uVar4;
  } while (!bVar2);
  return uVar4;
}

Assistant:

StringRef::size_type StringRef::find_last_of(StringRef Chars,
                                             size_t From) const {
  std::bitset<1 << CHAR_BIT> CharBits;
  for (size_type i = 0; i != Chars.size(); ++i)
    CharBits.set((unsigned char)Chars[i]);

  for (size_type i = std::min(From, Length) - 1, e = -1; i != e; --i)
    if (CharBits.test((unsigned char)Data[i]))
      return i;
  return npos;
}